

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O3

void png_set_compression_window_bits(png_structrp png_ptr,int window_bits)

{
  char *warning_message;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if (window_bits < 0x10) {
    if (7 < window_bits) goto LAB_00128526;
    window_bits = 8;
    warning_message = "Only compression windows >= 256 supported by PNG";
  }
  else {
    window_bits = 0xf;
    warning_message = "Only compression windows <= 32k supported by PNG";
  }
  png_warning(png_ptr,warning_message);
LAB_00128526:
  png_ptr->zlib_window_bits = window_bits;
  return;
}

Assistant:

void PNGAPI
png_set_compression_window_bits(png_structrp png_ptr, int window_bits)
{
   png_debug(1, "in png_set_compression_window_bits");

   if (png_ptr == NULL)
      return;

   /* Prior to 1.6.0 this would warn but then set the window_bits value. This
    * meant that negative window bits values could be selected that would cause
    * libpng to write a non-standard PNG file with raw deflate or gzip
    * compressed IDAT or ancillary chunks.  Such files can be read and there is
    * no warning on read, so this seems like a very bad idea.
    */
   if (window_bits > 15)
   {
      png_warning(png_ptr, "Only compression windows <= 32k supported by PNG");
      window_bits = 15;
   }

   else if (window_bits < 8)
   {
      png_warning(png_ptr, "Only compression windows >= 256 supported by PNG");
      window_bits = 8;
   }

   png_ptr->zlib_window_bits = window_bits;
}